

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Letter.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  QStandardItem *pQVar2;
  TextElement *pTVar3;
  Element *pEVar4;
  longlong __tmp;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  PreviewDialog preview;
  QStandardItemModel model;
  Report report;
  TextElement bodyElement;
  TextElement titleElement;
  AutoTableElement tableElement;
  TextElement footerText;
  TextElement signatureElement;
  TextElement body2Element;
  TextElement toElement;
  TextElement fromElement;
  QApplication app;
  QArrayDataPointer<char16_t> local_1b8 [2];
  QStandardItemModel local_180 [16];
  Report local_170 [24];
  QArrayDataPointer<char16_t> local_158;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f0;
  QArrayDataPointer<char16_t> local_d8;
  QByteArrayView local_b8;
  QArrayDataPointer<char16_t> local_a0;
  int local_84;
  TextElement local_80 [24];
  QApplication local_68 [16];
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  QByteArrayView local_38;
  QByteArrayView local_28;
  
  local_84 = argc;
  QApplication::QApplication(local_68,&local_84,argv,0x60204);
  KDReports::Report::Report(local_170,(QObject *)0x0);
  QStandardItemModel::QStandardItemModel(local_180,(QObject *)0x0);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x104038);
  QStandardItem::QStandardItem(pQVar2,(QString *)local_1b8);
  QStandardItemModel::setHorizontalHeaderItem((int)local_180,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x104040);
  QStandardItem::QStandardItem(pQVar2,(QString *)local_1b8);
  QStandardItemModel::setHorizontalHeaderItem((int)local_180,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x10404d);
  QStandardItem::QStandardItem(pQVar2,(QString *)local_1b8);
  QStandardItemModel::setItem((int)local_180,0,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x10405c);
  QStandardItem::QStandardItem(pQVar2,(QString *)local_1b8);
  QStandardItemModel::setItem((int)local_180,0,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x10406c);
  QStandardItem::QStandardItem(pQVar2,(QString *)local_1b8);
  QStandardItemModel::setItem((int)local_180,1,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x10407b);
  QStandardItem::QStandardItem(pQVar2,(QString *)local_1b8);
  QStandardItemModel::setItem((int)local_180,1,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x10408d);
  QStandardItem::QStandardItem(pQVar2,(QString *)local_1b8);
  QStandardItemModel::setItem((int)local_180,2,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pQVar2 = (QStandardItem *)operator_new(0x10);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x10409c);
  QStandardItem::QStandardItem(pQVar2,(QString *)local_1b8);
  QStandardItemModel::setItem((int)local_180,2,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_1b8[0].size = 0;
  KDReports::TextElement::TextElement(local_80,(QString *)local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  local_138.d = (Data *)0x1040aa;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_a0,(char **)&local_138);
  QVar5.m_data = (storage_type *)local_a0.d;
  QVar5.m_size = (qsizetype)local_1b8;
  QString::fromUtf8(QVar5);
  local_118.d = (Data *)CONCAT26(local_1b8[0].d._6_2_,
                                 CONCAT24(local_1b8[0].d._4_2_,local_1b8[0].d._0_4_));
  local_118.ptr = (char16_t *)CONCAT26(local_1b8[0].ptr._6_2_,local_1b8[0].ptr._0_6_);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_118.size = local_1b8[0].size;
  local_1b8[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(local_80,(QString *)&local_118);
  QByteArrayView::QByteArrayView<31ul>(&local_38,&anon_var_dwarf_ea);
  QVar6.m_data = (storage_type *)local_38.m_size;
  QVar6.m_size = (qsizetype)&local_a0;
  QString::fromUtf8(QVar6);
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(pTVar3,(QString *)&local_a0);
  local_b8.m_size = 0x1040d0;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_158,(char **)&local_b8);
  QVar7.m_data = (storage_type *)local_158.d;
  QVar7.m_size = (qsizetype)local_1b8;
  QString::fromUtf8(QVar7);
  local_138.d = (Data *)CONCAT26(local_1b8[0].d._6_2_,
                                 CONCAT24(local_1b8[0].d._4_2_,local_1b8[0].d._0_4_));
  local_138.ptr = (char16_t *)CONCAT26(local_1b8[0].ptr._6_2_,local_1b8[0].ptr._0_6_);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_138.size = local_1b8[0].size;
  local_1b8[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pTVar3 = (TextElement *)KDReports::TextElement::operator<<(pTVar3,(QString *)&local_138);
  local_d8.d = (Data *)0x1040da;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_b8,(char **)&local_d8);
  QVar8.m_data = (storage_type *)local_b8.m_size;
  QVar8.m_size = (qsizetype)local_1b8;
  QString::fromUtf8(QVar8);
  local_158.d = (Data *)CONCAT26(local_1b8[0].d._6_2_,
                                 CONCAT24(local_1b8[0].d._4_2_,local_1b8[0].d._0_4_));
  local_158.ptr = (char16_t *)CONCAT26(local_1b8[0].ptr._6_2_,local_1b8[0].ptr._0_6_);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_158.size = local_1b8[0].size;
  local_1b8[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  KDReports::TextElement::operator<<(pTVar3,(QString *)&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0xffff;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)local_170,(AlignmentFlag)local_80,(QColor *)0x1);
  KDReports::Report::addVerticalSpacing(10.0);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_1b8[0].size = 0;
  KDReports::TextElement::TextElement((TextElement *)&local_a0,(QString *)local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  local_158.d = (Data *)0x1040e2;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_138,(char **)&local_158);
  QVar9.m_data = (storage_type *)local_138.d;
  QVar9.m_size = (qsizetype)local_1b8;
  QString::fromUtf8(QVar9);
  local_118.d = (Data *)CONCAT26(local_1b8[0].d._6_2_,
                                 CONCAT24(local_1b8[0].d._4_2_,local_1b8[0].d._0_4_));
  local_118.ptr = (char16_t *)CONCAT26(local_1b8[0].ptr._6_2_,local_1b8[0].ptr._0_6_);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_118.size = local_1b8[0].size;
  local_1b8[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  pTVar3 = (TextElement *)
           KDReports::TextElement::operator<<((TextElement *)&local_a0,(QString *)&local_118);
  local_b8.m_size = 0x1040e7;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_158,(char **)&local_b8);
  QVar10.m_data = (storage_type *)local_158.d;
  QVar10.m_size = (qsizetype)local_1b8;
  QString::fromUtf8(QVar10);
  local_138.d = (Data *)CONCAT26(local_1b8[0].d._6_2_,
                                 CONCAT24(local_1b8[0].d._4_2_,local_1b8[0].d._0_4_));
  local_138.ptr = (char16_t *)CONCAT26(local_1b8[0].ptr._6_2_,local_1b8[0].ptr._0_6_);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_138.size = local_1b8[0].size;
  local_1b8[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  KDReports::TextElement::operator<<(pTVar3,(QString *)&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0xffff;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)local_170,(AlignmentFlag)&local_a0,(QColor *)0x1);
  KDReports::Report::addVerticalSpacing(10.0);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x10410c);
  KDReports::TextElement::TextElement((TextElement *)&local_138,(QString *)local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  KDReports::TextElement::setPointSize(14.0);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0xffff;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)local_170,(AlignmentFlag)&local_138,(QColor *)0x84);
  KDReports::Report::addVerticalSpacing(10.0);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_1b8[0].size = 0;
  KDReports::TextElement::TextElement((TextElement *)&local_158,(QString *)local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  KDReports::TextElement::setPointSize(10.0);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x104165);
  KDReports::TextElement::operator<<((TextElement *)&local_158,(QString *)local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  local_d8.d = (Data *)0x10417b;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_b8,(char **)&local_d8);
  QVar11.m_data = (storage_type *)local_b8.m_size;
  QVar11.m_size = (qsizetype)local_1b8;
  QString::fromUtf8(QVar11);
  local_118.d = (Data *)CONCAT26(local_1b8[0].d._6_2_,
                                 CONCAT24(local_1b8[0].d._4_2_,local_1b8[0].d._0_4_));
  local_118.ptr = (char16_t *)CONCAT26(local_1b8[0].ptr._6_2_,local_1b8[0].ptr._0_6_);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_118.size = local_1b8[0].size;
  local_1b8[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  KDReports::TextElement::operator<<((TextElement *)&local_158,(QString *)&local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0xffff;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)local_170,(AlignmentFlag)&local_158,(QColor *)0x8);
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)&local_118,(QAbstractItemModel *)local_180);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&local_118,0));
  KDReports::AbstractTableElement::setBorder(1.0);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0xffff;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)local_170,(AlignmentFlag)&local_118,(QColor *)0x84);
  KDReports::Report::addVerticalSpacing(6.0);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_1b8[0].size = 0;
  KDReports::TextElement::TextElement((TextElement *)&local_b8,(QString *)local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  KDReports::TextElement::setPointSize(10.0);
  local_58.d = (Data *)0x104402;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_f0,(char **)&local_58)
  ;
  QVar12.m_data = (storage_type *)local_f0.d;
  QVar12.m_size = (qsizetype)local_1b8;
  QString::fromUtf8(QVar12);
  local_d8.d = (Data *)CONCAT26(local_1b8[0].d._6_2_,
                                CONCAT24(local_1b8[0].d._4_2_,local_1b8[0].d._0_4_));
  local_d8.ptr = (char16_t *)CONCAT26(local_1b8[0].ptr._6_2_,local_1b8[0].ptr._0_6_);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_d8.size = local_1b8[0].size;
  local_1b8[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  KDReports::TextElement::operator<<((TextElement *)&local_b8,(QString *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0xffff;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)local_170,(AlignmentFlag)&local_b8,(QColor *)0x8);
  KDReports::Report::addVerticalSpacing(30.0);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_1b8[0].size = 0;
  KDReports::TextElement::TextElement((TextElement *)&local_d8,(QString *)local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  QMetaObject::tr((char *)local_1b8,(char *)&QObject::staticMetaObject,0x104501);
  pTVar3 = (TextElement *)
           KDReports::TextElement::operator<<((TextElement *)&local_d8,(QString *)local_1b8);
  QMetaObject::tr((char *)&local_f0,(char *)&QObject::staticMetaObject,0x10450a);
  KDReports::TextElement::operator<<(pTVar3,(QString *)&local_f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0xffff;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)local_170,(AlignmentFlag)&local_d8,(QColor *)0x1);
  pEVar4 = (Element *)KDReports::Report::footer(local_170,6);
  KDReports::HLineElement::HLineElement((HLineElement *)local_1b8);
  KDReports::Header::addElement(pEVar4,(AlignmentFlag)local_1b8);
  KDReports::HLineElement::~HLineElement((HLineElement *)local_1b8);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_1b8[0].size = 0;
  KDReports::TextElement::TextElement((TextElement *)&local_f0,(QString *)local_1b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  local_40 = "www.kdab.com | email: info@kdab.com | +46-563-540090";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_28,&local_40);
  QVar13.m_data = (storage_type *)local_28.m_size;
  QVar13.m_size = (qsizetype)local_1b8;
  QString::fromUtf8(QVar13);
  local_58.d = (Data *)CONCAT26(local_1b8[0].d._6_2_,
                                CONCAT24(local_1b8[0].d._4_2_,local_1b8[0].d._0_4_));
  local_58.ptr = (char16_t *)CONCAT26(local_1b8[0].ptr._6_2_,local_1b8[0].ptr._0_6_);
  local_1b8[0].d._0_4_ = 0;
  local_1b8[0].d._4_2_ = 0;
  local_1b8[0].d._6_2_ = 0;
  local_1b8[0].ptr._0_6_ = 0;
  local_1b8[0].ptr._6_2_ = 0;
  local_58.size = local_1b8[0].size;
  local_1b8[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b8);
  KDReports::TextElement::operator<<((TextElement *)&local_f0,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  KDReports::TextElement::setPointSize(8.0);
  pEVar4 = (Element *)KDReports::Report::footer(local_170,6);
  KDReports::Header::addElement(pEVar4,(AlignmentFlag)&local_f0);
  KDReports::PreviewDialog::PreviewDialog((PreviewDialog *)local_1b8,local_170,(QWidget *)0x0);
  iVar1 = QDialog::exec();
  KDReports::PreviewDialog::~PreviewDialog((PreviewDialog *)local_1b8);
  KDReports::TextElement::~TextElement((TextElement *)&local_f0);
  KDReports::TextElement::~TextElement((TextElement *)&local_d8);
  KDReports::TextElement::~TextElement((TextElement *)&local_b8);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_118);
  KDReports::TextElement::~TextElement((TextElement *)&local_158);
  KDReports::TextElement::~TextElement((TextElement *)&local_138);
  KDReports::TextElement::~TextElement((TextElement *)&local_a0);
  KDReports::TextElement::~TextElement(local_80);
  QStandardItemModel::~QStandardItemModel(local_180);
  KDReports::Report::~Report(local_170);
  QApplication::~QApplication(local_68);
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    QApplication app(argc, argv);

    // Create a report
    KDReports::Report report;

    // create a table:
    QStandardItemModel model;
    model.setHorizontalHeaderItem(0, new QStandardItem(QObject::tr("Product")));
    model.setHorizontalHeaderItem(1, new QStandardItem(QObject::tr("Release Date")));
    int row = 0;
    model.setItem(row, 0, new QStandardItem(QObject::tr("KD Reports 1.0")));
    model.setItem(row++, 1, new QStandardItem(QObject::tr("August 21, 2007")));
    model.setItem(row, 0, new QStandardItem(QObject::tr("KD Reports 1.1")));
    model.setItem(row++, 1, new QStandardItem(QObject::tr("November 25, 2008")));
    model.setItem(row, 0, new QStandardItem(QObject::tr("KD Reports 1.2")));
    model.setItem(row++, 1, new QStandardItem(QObject::tr("October, 2009")));

    // Add From: and To: information:
    KDReports::TextElement fromElement;
    fromElement << "From:\n"
                << QString::fromUtf8("Klarälvdalens Datakonsult AB\n") << "Rysktorp\n"
                << "Sweden\n";
    report.addElement(fromElement);
    report.addVerticalSpacing(10);
    KDReports::TextElement toElement;
    toElement << "To:\n"
              << "All Qt Users Out There In The World\n";
    report.addElement(toElement);
    report.addVerticalSpacing(10);

    // Add a text element for the title
    KDReports::TextElement titleElement(QObject::tr("Ever wanted to create a printed report from within your Qt application?\nLook no further!"));
    titleElement.setPointSize(14);
    report.addElement(titleElement, Qt::AlignCenter);

    // A bit of spacing (10 mm)
    report.addVerticalSpacing(10);

    // Add another text element, demonstrating "<<" operator
    KDReports::TextElement bodyElement;
    bodyElement.setPointSize(10);
    bodyElement << QObject::tr("Dear KDAB Customers,\n");
    bodyElement << "we are happy to introduce the newest member of KDAB's line of industry leading software"
                   " products: KD Reports. KD Reports is the Qt tool to easily create printable reports. It "
                   "provides all necessary features for a variety of applications:\n"
                   "Reports can be created programmatically, using an easy to use C++ API, or data-driven, "
                   "creating complete reports from XML sources. Report data "
                   "can be retrieved from SQL data sources. If KDAB's KDChart package is available, reports "
                   "can be garnished with different chart types. Watermarks, headers and footers are there "
                   "as well. Reports can be previewed manually, directly send to be printer, or saved as "
                   "PDF.\n";
    report.addElement(bodyElement, Qt::AlignJustify);

    // release date table:
    KDReports::AutoTableElement tableElement(&model);
    tableElement.setVerticalHeaderVisible(false);
    tableElement.setBorder(1);
    report.addElement(tableElement, Qt::AlignCenter);
    report.addVerticalSpacing(6);

    KDReports::TextElement body2Element;
    body2Element.setPointSize(10);
    body2Element << "Reporting is a rather general feature, and it seems a nice package providing this kind "
                    "of functionality to complement Qt was looked for by many. We at KDAB hope to make the "
                    "life of our customers more enjoyable with it. Let us know if we were successful!\n";
    report.addElement(body2Element, Qt::AlignJustify);
    report.addVerticalSpacing(30);
    KDReports::TextElement signatureElement;
    signatureElement << QObject::tr("Cheers,\n") << QObject::tr("Klarälvdalens Datakonsult AB, Platform-independent software solutions");

    report.addElement(signatureElement);

    // add footer with contact information:
    report.footer().addElement(KDReports::HLineElement());
    KDReports::TextElement footerText;
    footerText << "www.kdab.com | email: info@kdab.com | +46-563-540090";
    footerText.setPointSize(8);
    report.footer().addElement(footerText, Qt::AlignCenter);

    // To show a print preview:
    KDReports::PreviewDialog preview(&report);
    return preview.exec();
}